

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

int GetShaderLocation(Shader shader,char *uniformName)

{
  GLint GVar1;
  
  GVar1 = (*glad_glGetUniformLocation)(shader.id,uniformName);
  return GVar1;
}

Assistant:

int rlGetLocationUniform(unsigned int shaderId, const char *uniformName)
{
    int location = -1;
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    location = glGetUniformLocation(shaderId, uniformName);

    //if (location == -1) TRACELOG(RL_LOG_WARNING, "SHADER: [ID %i] Failed to find shader uniform: %s", shaderId, uniformName);
    //else TRACELOG(RL_LOG_INFO, "SHADER: [ID %i] Shader uniform (%s) set at location: %i", shaderId, uniformName, location);
#endif
    return location;
}